

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O1

int do_gotoeop(int f,int n,int *i)

{
  line *plVar1;
  long lVar2;
  mgwin *pmVar3;
  line *plVar4;
  bool bVar5;
  int iVar6;
  line *plVar7;
  ulong uVar8;
  ushort **ppuVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  line *plVar13;
  bool bVar14;
  bool bVar15;
  
  pmVar3 = curwp;
  if (n < 0) {
    iVar6 = gotobop(f,-n);
    return iVar6;
  }
  if (n != 0) {
    plVar1 = curbp->b_headp;
    plVar13 = curwp->w_dotp;
    iVar6 = 1;
    if (1 < n) {
      iVar6 = n;
    }
    iVar10 = 0;
    do {
      iVar10 = iVar10 + 1;
      *i = iVar10;
      if (plVar13->l_fp != plVar1) {
        iVar12 = pmVar3->w_dotline;
        bVar15 = false;
        plVar4 = plVar13->l_fp;
        do {
          plVar7 = plVar4;
          pmVar3->w_doto = 0;
          uVar8 = (ulong)plVar13->l_used;
          bVar14 = 0 < (long)uVar8;
          if ((long)uVar8 < 1) {
LAB_00114ba1:
            bVar5 = false;
            if (bVar15) break;
          }
          else {
            ppuVar9 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar9 + (ulong)(byte)*plVar13->l_text * 2 + 1) & 0x20) != 0) {
              uVar11 = 0;
              do {
                if (uVar8 - 1 == uVar11) goto LAB_00114ba1;
                lVar2 = uVar11 + 1;
                uVar11 = uVar11 + 1;
              } while ((*(byte *)((long)*ppuVar9 + (ulong)(byte)plVar13->l_text[lVar2] * 2 + 1) &
                       0x20) != 0);
              bVar14 = uVar11 < uVar8;
            }
            bVar5 = true;
            if (!bVar14) goto LAB_00114ba1;
          }
          bVar15 = bVar5;
          pmVar3->w_dotp = plVar7;
          iVar12 = iVar12 + 1;
          pmVar3->w_dotline = iVar12;
          plVar4 = plVar7->l_fp;
          plVar13 = plVar7;
        } while (plVar7->l_fp != plVar1);
      }
    } while (iVar10 != iVar6);
  }
  bVar15 = curwp->w_dotp->l_fp == curbp->b_headp;
  if (bVar15) {
    gotoeol(8,1);
    curwp->w_rflag = curwp->w_rflag | 2;
  }
  else {
    curwp->w_rflag = curwp->w_rflag | 2;
  }
  return (uint)!bVar15;
}

Assistant:

int
do_gotoeop(int f, int n, int *i)
{
	int col, nospace, j = 0;

	/* the other way... */
	if (n < 0)
		return (gotobop(f, -n));

	/* for each one asked for */
	while (n-- > 0) {
		*i = ++j;
		nospace = 0;
		while (lforw(curwp->w_dotp) != curbp->b_headp) {
			col = 0;
			curwp->w_doto = 0;

			while (col < llength(curwp->w_dotp) &&
			    (isspace(lgetc(curwp->w_dotp, col))))
				col++;

			if (col >= llength(curwp->w_dotp)) {
				if (nospace)
					break;
			} else
				nospace = 1;

			curwp->w_dotp = lforw(curwp->w_dotp);
			curwp->w_dotline++;

		}
	}
	/* do not continue after end of buffer */
	if (lforw(curwp->w_dotp) == curbp->b_headp) {
		gotoeol(FFRAND, 1);
		curwp->w_rflag |= WFMOVE;
		return (FALSE);
	}

	/* force screen update */
	curwp->w_rflag |= WFMOVE;
	return (TRUE);
}